

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandMoveNames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (globalUtilOptind + 1 == argc) {
      pcVar4 = argv[globalUtilOptind];
      FileType = Io_ReadFileType(pcVar4);
      pNtk_00 = Io_Read(pcVar4,FileType,1,0);
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        return 1;
      }
      if (pNtk->vPis->nSize == pNtk_00->vPis->nSize) {
        if (pNtk->vPos->nSize == pNtk_00->vPos->nSize) {
          if (pNtk->nObjCounts[8] == pNtk_00->nObjCounts[8]) {
            Abc_NtkMoveNames(pNtk,pNtk_00);
            Abc_NtkDelete(pNtk_00);
            return 0;
          }
          Abc_NtkDelete(pNtk_00);
          uVar3 = (ulong)(uint)pNtk->nObjCounts[8];
          uVar2 = (ulong)(uint)pNtk_00->nObjCounts[8];
          pcVar4 = 
          "The flop count (%d) of the first network is not equal to flop count (%d) of the second network.\n"
          ;
        }
        else {
          Abc_NtkDelete(pNtk_00);
          uVar3 = (ulong)(uint)pNtk->vPos->nSize;
          uVar2 = (ulong)(uint)pNtk_00->vPos->nSize;
          pcVar4 = 
          "The PO count (%d) of the first network is not equal to PO count (%d) of the second network.\n"
          ;
        }
      }
      else {
        Abc_NtkDelete(pNtk_00);
        uVar3 = (ulong)(uint)pNtk->vPis->nSize;
        uVar2 = (ulong)(uint)pNtk_00->vPis->nSize;
        pcVar4 = 
        "The PI count (%d) of the first network is not equal to PI count (%d) of the second network.\n"
        ;
      }
      Abc_Print(-1,pcVar4,uVar3,uVar2);
      return 0;
    }
    pcVar4 = "The network to take names from is not given.\n";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: move_names [-h] <file>\n");
    Abc_Print(-2,"\t         moves PI/PO/latch names from the other network\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar4 = "\t<file> : file with network that has required names\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandMoveNames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkMoveNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pOld );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtk2;
    char * FileName;
    int c;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    // get the second network
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "The network to take names from is not given.\n" );
        return 1;
    }

    // read the second network
    FileName = argv[globalUtilOptind];
    pNtk2 = Io_Read( FileName, Io_ReadFileType(FileName), 1, 0 );
    if ( pNtk2 == NULL )
        return 1;

    // compare inputs/outputs
    if ( Abc_NtkPiNum(pNtk) != Abc_NtkPiNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The PI count (%d) of the first network is not equal to PI count (%d) of the second network.\n", Abc_NtkPiNum(pNtk), Abc_NtkPiNum(pNtk2) );
        return 0;
    }
    // compare inputs/outputs
    if ( Abc_NtkPoNum(pNtk) != Abc_NtkPoNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The PO count (%d) of the first network is not equal to PO count (%d) of the second network.\n", Abc_NtkPoNum(pNtk), Abc_NtkPoNum(pNtk2) );
        return 0;
    }
    // compare inputs/outputs
    if ( Abc_NtkLatchNum(pNtk) != Abc_NtkLatchNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The flop count (%d) of the first network is not equal to flop count (%d) of the second network.\n", Abc_NtkLatchNum(pNtk), Abc_NtkLatchNum(pNtk2) );
        return 0;
    }
    Abc_NtkMoveNames( pNtk, pNtk2 );
    Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    Abc_Print( -2, "usage: move_names [-h] <file>\n" );
    Abc_Print( -2, "\t         moves PI/PO/latch names from the other network\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file with network that has required names\n");
    return 1;
}